

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

locateresult __thiscall
tetgenmesh::locate(tetgenmesh *this,point searchpt,triface *searchtet,int chkencflag)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  tetrahedron *pppdVar9;
  ulong uVar10;
  long lVar11;
  tetrahedron unaff_RBP;
  tetrahedron unaff_R12;
  tetrahedron unaff_R13;
  tetrahedron ppdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pppdVar9 = searchtet->tet;
  if (pppdVar9 == (tetrahedron *)0x0) {
    pppdVar9 = (this->recenttet).tet;
    searchtet->tet = pppdVar9;
  }
  if (pppdVar9[7] == (tetrahedron)this->dummypoint) {
    searchtet->tet = (tetrahedron *)((ulong)pppdVar9[3] & 0xfffffffffffffff0);
  }
  for (iVar5 = 0; searchtet->ver = iVar5, iVar5 < 4; iVar5 = iVar5 + 1) {
    pppdVar9 = searchtet->tet;
    unaff_R13 = pppdVar9[orgpivot[iVar5]];
    unaff_R12 = pppdVar9[destpivot[iVar5]];
    unaff_RBP = pppdVar9[apexpivot[iVar5]];
    dVar13 = orient3d((double *)unaff_R13,(double *)unaff_R12,(double *)unaff_RBP,searchpt);
    iVar5 = searchtet->ver;
    if (dVar13 < 0.0) break;
  }
  if (iVar5 == 4) {
    terminatetetgen(this,2);
    iVar5 = searchtet->ver;
  }
  ppdVar12 = searchtet->tet[oppopivot[iVar5]];
  do {
    if (ppdVar12 == (tetrahedron)searchpt) {
      iVar5 = esymtbl[iVar5];
      searchtet->ver = iVar5;
      searchtet->ver = eprevtbl[iVar5];
      return ONVERTEX;
    }
    dVar13 = orient3d((double *)unaff_R12,(double *)unaff_RBP,(double *)ppdVar12,searchpt);
    dVar14 = orient3d((double *)unaff_RBP,(double *)unaff_R13,(double *)ppdVar12,searchpt);
    dVar15 = orient3d((double *)unaff_R13,(double *)unaff_R12,(double *)ppdVar12,searchpt);
    if (0.0 <= dVar13) {
      if (0.0 <= dVar14) {
        if (0.0 <= dVar15) {
          if ((dVar13 != 0.0) || (NAN(dVar13))) {
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              if ((dVar15 == 0.0) && (!NAN(dVar15))) {
                searchtet->ver = esymtbl[searchtet->ver];
                return ONFACE;
              }
              return INTETRAHEDRON;
            }
            lVar11 = (long)eprevesymtbl[searchtet->ver];
            searchtet->ver = eprevesymtbl[searchtet->ver];
            if (dVar15 != 0.0) {
              return ONFACE;
            }
            if (NAN(dVar15)) {
              return ONFACE;
            }
            piVar7 = eprevtbl;
          }
          else {
            lVar11 = (long)enextesymtbl[searchtet->ver];
            searchtet->ver = enextesymtbl[searchtet->ver];
            if ((dVar14 == 0.0) && (!NAN(dVar14))) {
              searchtet->ver = eprevtbl[lVar11];
              return (dVar15 == 0.0) + ONEDGE;
            }
            if (dVar15 != 0.0) {
              return ONFACE;
            }
            if (NAN(dVar15)) {
              return ONFACE;
            }
            piVar7 = enexttbl;
          }
          searchtet->ver = piVar7[lVar11];
          return ONEDGE;
        }
      }
      else if ((0.0 <= dVar15) ||
              (auVar3._8_8_ = 0, auVar3._0_8_ = this->randomseed * 0x556 + 0x24d69,
              this->randomseed = SUB168(auVar3 % ZEXT816(0xae529),0),
              (auVar3 % ZEXT816(0xae529) & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
LAB_0011d52d:
        piVar7 = eprevesymtbl;
        goto LAB_0011d534;
      }
LAB_0011d518:
      piVar7 = esymtbl;
    }
    else if (0.0 <= dVar14) {
      piVar7 = enextesymtbl;
      if (dVar15 < 0.0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = this->randomseed * 0x556 + 0x24d69;
        this->randomseed = SUB168(auVar4 % ZEXT816(0xae529),0);
        piVar7 = enextesymtbl;
        if ((auVar4 % ZEXT816(0xae529) & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0011d518;
      }
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->randomseed * 0x556 + 0x24d69;
      uVar10 = SUB168(auVar2 % ZEXT816(0xae529),0);
      this->randomseed = uVar10;
      if (0.0 <= dVar15) {
        piVar7 = enextesymtbl;
        if ((auVar2 % ZEXT816(0xae529) & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0011d52d;
      }
      else {
        piVar8 = eprevesymtbl;
        iVar5 = (int)(uVar10 % 3);
        if (iVar5 != 1) {
          piVar8 = esymtbl;
        }
        piVar7 = enextesymtbl;
        if (iVar5 != 0) {
          piVar7 = piVar8;
        }
      }
    }
LAB_0011d534:
    uVar1 = piVar7[searchtet->ver];
    searchtet->ver = uVar1;
    if (((chkencflag != 0) && (ppdVar12 = searchtet->tet[9], ppdVar12 != (tetrahedron)0x0)) &&
       (ppdVar12[uVar1 & 3] != (double *)0x0)) {
      return ENCSUBFACE;
    }
    ppdVar12 = searchtet->tet[uVar1 & 3];
    uVar6 = (uint)ppdVar12 & 0xf;
    searchtet->ver = uVar6;
    pppdVar9 = (tetrahedron *)((ulong)ppdVar12 & 0xfffffffffffffff0);
    searchtet->tet = pppdVar9;
    iVar5 = fsymtbl[(int)uVar1][uVar6];
    searchtet->ver = iVar5;
    ppdVar12 = pppdVar9[oppopivot[iVar5]];
    if (ppdVar12 == (tetrahedron)this->dummypoint) {
      return OUTSIDE;
    }
    unaff_R13 = pppdVar9[orgpivot[iVar5]];
    unaff_R12 = pppdVar9[destpivot[iVar5]];
    unaff_RBP = pppdVar9[apexpivot[iVar5]];
  } while( true );
}

Assistant:

enum tetgenmesh::locateresult 
  tetgenmesh::locate(point searchpt, triface* searchtet, int chkencflag)
{
  point torg, tdest, tapex, toppo;
  enum {ORGMOVE, DESTMOVE, APEXMOVE} nextmove;
  REAL ori, oriorg, oridest, oriapex;
  enum locateresult loc = OUTSIDE;
  int t1ver;
  int s;

  if (searchtet->tet == NULL) {
    // A null tet. Choose the recenttet as the starting tet.
    searchtet->tet = recenttet.tet;
  }

  // Check if we are in the outside of the convex hull.
  if (ishulltet(*searchtet)) {
    // Get its adjacent tet (inside the hull).
    searchtet->ver = 3;
    fsymself(*searchtet);
  }

  // Let searchtet be the face such that 'searchpt' lies above to it.
  for (searchtet->ver = 0; searchtet->ver < 4; searchtet->ver++) {
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);
    ori = orient3d(torg, tdest, tapex, searchpt); 
    if (ori < 0.0) break;
  }
  if (searchtet->ver == 4) {
    terminatetetgen(this, 2);
  }

  // Walk through tetrahedra to locate the point.
  while (true) {

    toppo = oppo(*searchtet);
    
    // Check if the vertex is we seek.
    if (toppo == searchpt) {
      // Adjust the origin of searchtet to be searchpt.
      esymself(*searchtet);
      eprevself(*searchtet);
      loc = ONVERTEX; // return ONVERTEX;
      break;
    }

    // We enter from one of serarchtet's faces, which face do we exit?
    oriorg = orient3d(tdest, tapex, toppo, searchpt); 
    oridest = orient3d(tapex, torg, toppo, searchpt);
    oriapex = orient3d(torg, tdest, toppo, searchpt);

    // Now decide which face to move. It is possible there are more than one
    //   faces are viable moves. If so, randomly choose one.
    if (oriorg < 0) {
      if (oridest < 0) {
        if (oriapex < 0) {
          // All three faces are possible.
          s = randomnation(3); // 's' is in {0,1,2}.
          if (s == 0) {
            nextmove = ORGMOVE;
          } else if (s == 1) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Two faces, opposite to origin and destination, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = DESTMOVE;
          }
        }
      } else {
        if (oriapex < 0) {
          // Two faces, opposite to origin and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to origin is viable.
          nextmove = ORGMOVE;
        }
      }
    } else {
      if (oridest < 0) {
        if (oriapex < 0) {
          // Two faces, opposite to destination and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to destination is viable.
          nextmove = DESTMOVE;
        }
      } else {
        if (oriapex < 0) {
          // Only the face opposite to apex is viable.
          nextmove = APEXMOVE;
        } else {
          // The point we seek must be on the boundary of or inside this
          //   tetrahedron. Check for boundary cases.
          if (oriorg == 0) {
            // Go to the face opposite to origin.
            enextesymself(*searchtet);
            if (oridest == 0) {
              eprevself(*searchtet); // edge oppo->apex
              if (oriapex == 0) {
                // oppo is duplicated with p.
                loc = ONVERTEX; // return ONVERTEX;
                break;
              }
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            if (oriapex == 0) {
              enextself(*searchtet); // edge dest->oppo
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oridest == 0) {
            // Go to the face opposite to destination.
            eprevesymself(*searchtet);
            if (oriapex == 0) {
              eprevself(*searchtet); // edge oppo->org
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oriapex == 0) {
            // Go to the face opposite to apex
            esymself(*searchtet);
            loc = ONFACE; // return ONFACE;
            break;
          }
          loc = INTETRAHEDRON; // return INTETRAHEDRON;
          break;
        }
      }
    }
    
    // Move to the selected face.
    if (nextmove == ORGMOVE) {
      enextesymself(*searchtet);
    } else if (nextmove == DESTMOVE) {
      eprevesymself(*searchtet);
    } else {
      esymself(*searchtet);
    }
    if (chkencflag) {
      // Check if we are walking across a subface.
      if (issubface(*searchtet)) {
        loc = ENCSUBFACE;
        break;
      }
    }
    // Move to the adjacent tetrahedron (maybe a hull tetrahedron).
    fsymself(*searchtet);
    if (oppo(*searchtet) == dummypoint) {
      loc = OUTSIDE; // return OUTSIDE;
      break;
    }

    // Retreat the three vertices of the base face.
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);

  } // while (true)

  return loc;
}